

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccpath.h
# Opt level: O2

Package * __thiscall
CCDir::install(Package *__return_storage_ptr__,CCDir *this,string *include,string *lib,string *bin,
              string *libname,string version)

{
  string *__rhs;
  string *__rhs_00;
  pointer pbVar1;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  binfiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libfiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerfiles;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->version)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->version).field_2;
  (__return_storage_ptr__->version)._M_string_length = 0;
  (__return_storage_ptr__->version).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->include_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->include_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->include_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->lib_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->lib_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->lib_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->dll_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->dll_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->dll_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->version);
  std::__cxx11::string::string((string *)&local_f0,(string *)include);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"*.*",(allocator<char> *)&cmd);
  ispring::File::FileList(&headerfiles,&local_f0,&local_110,true);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  for (pbVar1 = headerfiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != headerfiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    std::__cxx11::string::string((string *)&cmd,(string *)pbVar1);
    std::__cxx11::string::find((char *)&cmd,0x131b9c);
    std::__cxx11::string::substr((ulong)&binfiles,(ulong)&cmd);
    std::operator+(&local_260,&this->include_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&binfiles);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->include_files,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&binfiles);
    std::__cxx11::string::~string((string *)&cmd);
  }
  std::operator+(&local_130,include,"/*");
  std::__cxx11::string::string((string *)&local_150,(string *)this);
  ispring::File::DirectoryCopy(&local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_170,(string *)lib);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"*.*",(allocator<char> *)&cmd);
  ispring::File::FileList(&libfiles,&local_170,&local_190,true);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  __rhs = &this->lib64_path;
  for (pbVar1 = libfiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != libfiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar1);
    ispring::String::GetNameOfFile(&local_260,&local_50);
    std::operator+(&cmd,__rhs,&local_260);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->lib_files,&cmd);
    std::__cxx11::string::~string((string *)&cmd);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator+(&local_1b0,"cp ",lib);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&binfiles,
                 &local_1b0,"/* ");
  std::operator+(&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&binfiles,
                 __rhs);
  std::operator+(&cmd,&local_260," -P");
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&binfiles);
  std::__cxx11::string::~string((string *)&local_1b0);
  system(cmd._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&cmd);
  std::__cxx11::string::string((string *)&local_1d0,(string *)bin);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"*.*",(allocator<char> *)&cmd);
  ispring::File::FileList(&binfiles,&local_1d0,&local_1f0,true);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __rhs_00 = &this->dll64_path;
  for (pbVar1 = binfiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != binfiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    std::__cxx11::string::string((string *)&local_b0,(string *)pbVar1);
    std::__cxx11::string::string((string *)&local_d0,(string *)pbVar1);
    ispring::String::GetNameOfFile(&cmd,&local_d0);
    std::operator+(&local_70,__rhs_00,&cmd);
    ispring::File::FileCopy(&local_b0,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&cmd);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string((string *)&local_90,(string *)pbVar1);
    ispring::String::GetNameOfFile(&local_260,&local_90);
    std::operator+(&cmd,__rhs_00,&local_260);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->dll_files,&cmd);
    std::__cxx11::string::~string((string *)&cmd);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_90);
  }
  cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
  cmd._M_string_length = 0;
  cmd.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_260,"chmod 777 -R ",&this->include_path);
  std::__cxx11::string::operator=((string *)&cmd,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  system(cmd._M_dataplus._M_p);
  std::operator+(&local_260,"chmod 777 -R ",__rhs);
  std::__cxx11::string::operator=((string *)&cmd,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  system(cmd._M_dataplus._M_p);
  std::operator+(&local_260,"chmod 777 -R ",__rhs_00);
  std::__cxx11::string::operator=((string *)&cmd,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  system(cmd._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&cmd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&binfiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&libfiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&headerfiles);
  return __return_storage_ptr__;
}

Assistant:

Package install(std::string include,std::string lib,std::string bin,std::string libname,std::string version){
        Package package;
        package.name=libname;
        package.version=version;
        auto headerfiles=ispring::File::FileList(include,"*.*",true);
        for(auto h:headerfiles) {
            size_t pos = h.find("include") + 8;
            package.include_files.push_back(include_path+h.substr(pos, h.length() - pos));
        }
#if defined(_WIN32) || defined(_WIN64)
        ispring::File::DirectoryCopy(include,include_path);
#else
		ispring::File::DirectoryCopy(include + "/*", include_path);
#endif


        auto libfiles=ispring::File::FileList(lib,"*.*",true);
        for(auto&libfile:libfiles){
#if defined(_WIN32) || defined(_WIN64)
            ispring::File::FileCopy(libfile,lib64_path+ispring::String::GetNameOfFile(libfile));
#endif
            package.lib_files.push_back(lib64_path+ispring::String::GetNameOfFile(libfile));
        }
#if defined(__linux__)
        {
            std::string cmd = "cp " + lib + "/* " + lib64_path + " -P";
            system(cmd.c_str());
        }
#endif
        auto binfiles=ispring::File::FileList(bin,"*.*",true);
        for(auto&binfile:binfiles){
            ispring::File::FileCopy(binfile, dll64_path + ispring::String::GetNameOfFile(binfile));
            package.dll_files.push_back(dll64_path+ispring::String::GetNameOfFile(binfile));
        }
#if defined(__linux__)
        std::string cmd;
        cmd="chmod 777 -R " + include_path;
        system(cmd.c_str());
        cmd="chmod 777 -R " + lib64_path;
        system(cmd.c_str());
        cmd="chmod 777 -R " + dll64_path;
        system(cmd.c_str());
#endif
        return package;
    }